

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::eval::Equation_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
::eval_internal(Equation_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
                *this,Dispatch_State *t_ss)

{
  Opers t_oper;
  bool bVar1;
  reference pvVar2;
  Type_Info *pTVar3;
  const_reference pvVar4;
  pointer pAVar5;
  reference this_00;
  Dispatch_Engine *pDVar6;
  reference pvVar7;
  eval_error *peVar8;
  Dispatch_State *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar9;
  string_view t_name;
  string_view t_name_00;
  dispatch_error *e_2;
  __sv_type local_200;
  undefined1 local_1ea;
  allocator<char> local_1e9;
  string local_1e8;
  Boxed_Value local_1c8 [4];
  dispatch_error *e;
  dispatch_error *e_1;
  __sv_type local_128;
  Boxed_Value local_118;
  Boxed_Value local_108;
  Boxed_Value local_f8 [4];
  exception *anon_var_0;
  string local_b0;
  undefined1 local_8a;
  allocator<char> local_89;
  string local_88;
  anon_class_16_2_3fe617c6 local_58;
  undefined1 local_48 [8];
  array<chaiscript::Boxed_Value,_2UL> params;
  Function_Push_Pop fpp;
  Dispatch_State *t_ss_local;
  Equation_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *this_local;
  
  detail::Function_Push_Pop::Function_Push_Pop
            ((Function_Push_Pop *)
             &params._M_elems[1].m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,in_RDX);
  local_58.this =
       (Equation_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)t_ss;
  eval_internal::anon_class_16_2_3fe617c6::operator()
            ((array<chaiscript::Boxed_Value,_2UL> *)local_48,&local_58);
  pvVar2 = std::array<chaiscript::Boxed_Value,_2UL>::operator[]
                     ((array<chaiscript::Boxed_Value,_2UL> *)local_48,0);
  bVar1 = Boxed_Value::is_return_value(pvVar2);
  if (bVar1) {
    local_8a = 1;
    peVar8 = (eval_error *)__cxa_allocate_exception(0x90);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Error, cannot assign to temporary value.",&local_89);
    exception::eval_error::eval_error(peVar8,&local_88);
    local_8a = 0;
    __cxa_throw(peVar8,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
  }
  pvVar2 = std::array<chaiscript::Boxed_Value,_2UL>::operator[]
                     ((array<chaiscript::Boxed_Value,_2UL> *)local_48,0);
  bVar1 = Boxed_Value::is_const(pvVar2);
  if (bVar1) {
    anon_var_0._6_1_ = 1;
    peVar8 = (eval_error *)__cxa_allocate_exception(0x90);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"Error, cannot assign to constant value.",
               (allocator<char> *)((long)&anon_var_0 + 7));
    exception::eval_error::eval_error(peVar8,&local_b0);
    anon_var_0._6_1_ = 0;
    __cxa_throw(peVar8,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
  }
  if (*(int *)&t_ss[3].m_stack_holder._M_data != 0x20) {
    pvVar2 = std::array<chaiscript::Boxed_Value,_2UL>::operator[]
                       ((array<chaiscript::Boxed_Value,_2UL> *)local_48,0);
    pTVar3 = Boxed_Value::get_type_info(pvVar2);
    bVar1 = Type_Info::is_arithmetic(pTVar3);
    if (bVar1) {
      pvVar2 = std::array<chaiscript::Boxed_Value,_2UL>::operator[]
                         ((array<chaiscript::Boxed_Value,_2UL> *)local_48,1);
      pTVar3 = Boxed_Value::get_type_info(pvVar2);
      bVar1 = Type_Info::is_arithmetic(pTVar3);
      if (bVar1) {
        t_oper = *(Opers *)&t_ss[3].m_stack_holder._M_data;
        pvVar2 = std::array<chaiscript::Boxed_Value,_2UL>::operator[]
                           ((array<chaiscript::Boxed_Value,_2UL> *)local_48,0);
        pvVar7 = std::array<chaiscript::Boxed_Value,_2UL>::operator[]
                           ((array<chaiscript::Boxed_Value,_2UL> *)local_48,1);
        Boxed_Number::do_oper((Boxed_Number *)this,t_oper,pvVar2,pvVar7);
        goto LAB_0074e28e;
      }
    }
  }
  if (*(int *)&t_ss[3].m_stack_holder._M_data != 6) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &t_ss->m_conversions,":=");
    if (bVar1) {
      pvVar2 = std::array<chaiscript::Boxed_Value,_2UL>::operator[]
                         ((array<chaiscript::Boxed_Value,_2UL> *)local_48,0);
      bVar1 = Boxed_Value::is_undef(pvVar2);
      if (!bVar1) {
        pvVar2 = std::array<chaiscript::Boxed_Value,_2UL>::operator[]
                           ((array<chaiscript::Boxed_Value,_2UL> *)local_48,0);
        pvVar7 = std::array<chaiscript::Boxed_Value,_2UL>::operator[]
                           ((array<chaiscript::Boxed_Value,_2UL> *)local_48,1);
        bVar1 = Boxed_Value::type_match(pvVar2,pvVar7);
        if (!bVar1) {
          local_1ea = 1;
          peVar8 = (eval_error *)__cxa_allocate_exception(0x90);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1e8,"Mismatched types in equation",&local_1e9);
          exception::eval_error::eval_error(peVar8,&local_1e8);
          local_1ea = 0;
          __cxa_throw(peVar8,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
        }
      }
      pvVar2 = std::array<chaiscript::Boxed_Value,_2UL>::operator[]
                         ((array<chaiscript::Boxed_Value,_2UL> *)local_48,0);
      std::array<chaiscript::Boxed_Value,_2UL>::operator[]
                ((array<chaiscript::Boxed_Value,_2UL> *)local_48,1);
      Boxed_Value::assign(local_1c8,pvVar2);
      Boxed_Value::~Boxed_Value(local_1c8);
      pvVar2 = std::array<chaiscript::Boxed_Value,_2UL>::operator[]
                         ((array<chaiscript::Boxed_Value,_2UL> *)local_48,0);
      Boxed_Value::reset_return_value(pvVar2);
      pvVar2 = std::array<chaiscript::Boxed_Value,_2UL>::operator[]
                         ((array<chaiscript::Boxed_Value,_2UL> *)local_48,1);
      Boxed_Value::Boxed_Value((Boxed_Value *)this,pvVar2);
    }
    else {
      pDVar6 = chaiscript::detail::Dispatch_State::operator->(in_RDX);
      local_200 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)&t_ss->m_conversions);
      Function_Params::Function_Params<2ul>
                ((Function_Params *)&e_2,(array<chaiscript::Boxed_Value,_2UL> *)local_48);
      chaiscript::detail::Dispatch_State::conversions(in_RDX);
      t_name_00._M_str = (char *)local_200._M_len;
      t_name_00._M_len = (size_t)pDVar6;
      chaiscript::detail::Dispatch_Engine::call_function
                ((Dispatch_Engine *)this,t_name_00,(atomic_uint_fast32_t *)local_200._M_str,
                 (Function_Params *)&t_ss[3].m_conversions,(Type_Conversions_State *)&e_2);
    }
    goto LAB_0074e28e;
  }
  pvVar2 = std::array<chaiscript::Boxed_Value,_2UL>::operator[]
                     ((array<chaiscript::Boxed_Value,_2UL> *)local_48,0);
  bVar1 = Boxed_Value::is_undef(pvVar2);
  if (bVar1) {
    bVar1 = std::
            vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
            ::empty((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
                     *)&t_ss[2].m_conversions);
    if (!bVar1) {
      pvVar4 = std::
               vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
               ::operator[]((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
                             *)&t_ss[2].m_conversions,0);
      pAVar5 = std::
               unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
               ::operator->(pvVar4);
      if ((pAVar5->super_AST_Node).identifier == Reference) {
LAB_0074da73:
        pvVar2 = std::array<chaiscript::Boxed_Value,_2UL>::operator[]
                           ((array<chaiscript::Boxed_Value,_2UL> *)local_48,0);
        std::array<chaiscript::Boxed_Value,_2UL>::operator[]
                  ((array<chaiscript::Boxed_Value,_2UL> *)local_48,1);
        Boxed_Value::assign(local_f8,pvVar2);
        Boxed_Value::~Boxed_Value(local_f8);
        pvVar2 = std::array<chaiscript::Boxed_Value,_2UL>::operator[]
                           ((array<chaiscript::Boxed_Value,_2UL> *)local_48,0);
        Boxed_Value::reset_return_value(pvVar2);
        pvVar2 = std::array<chaiscript::Boxed_Value,_2UL>::operator[]
                           ((array<chaiscript::Boxed_Value,_2UL> *)local_48,1);
        Boxed_Value::Boxed_Value((Boxed_Value *)this,pvVar2);
        goto LAB_0074e28e;
      }
      pvVar4 = std::
               vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
               ::operator[]((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
                             *)&t_ss[2].m_conversions,0);
      pAVar5 = std::
               unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
               ::operator->(pvVar4);
      bVar1 = std::
              vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
              ::empty(&pAVar5->children);
      if (!bVar1) {
        pvVar4 = std::
                 vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
                 ::operator[]((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
                               *)&t_ss[2].m_conversions,0);
        pAVar5 = std::
                 unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
                 ::operator->(pvVar4);
        this_00 = std::
                  vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
                  ::operator[](&pAVar5->children,0);
        pAVar5 = std::
                 unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
                 ::operator->(this_00);
        if ((pAVar5->super_AST_Node).identifier == Reference) goto LAB_0074da73;
      }
    }
    pvVar2 = std::array<chaiscript::Boxed_Value,_2UL>::operator[]
                       ((array<chaiscript::Boxed_Value,_2UL> *)local_48,1);
    Boxed_Value::Boxed_Value(&local_118,pvVar2);
    detail::clone_if_necessary
              ((detail *)&local_108,&local_118,
               (atomic_uint_fast32_t *)&t_ss[3].m_conversions.m_saves,in_RDX);
    pvVar2 = std::array<chaiscript::Boxed_Value,_2UL>::operator[]
                       ((array<chaiscript::Boxed_Value,_2UL> *)local_48,1);
    Boxed_Value::operator=(pvVar2,&local_108);
    Boxed_Value::~Boxed_Value(&local_108);
    Boxed_Value::~Boxed_Value(&local_118);
  }
  pDVar6 = chaiscript::detail::Dispatch_State::operator->(in_RDX);
  local_128 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&t_ss->m_conversions);
  Function_Params::Function_Params<2ul>
            ((Function_Params *)&e_1,(array<chaiscript::Boxed_Value,_2UL> *)local_48);
  chaiscript::detail::Dispatch_State::conversions(in_RDX);
  t_name._M_str = (char *)local_128._M_len;
  t_name._M_len = (size_t)pDVar6;
  chaiscript::detail::Dispatch_Engine::call_function
            ((Dispatch_Engine *)this,t_name,(atomic_uint_fast32_t *)local_128._M_str,
             (Function_Params *)&t_ss[3].m_conversions,(Type_Conversions_State *)&e_1);
LAB_0074e28e:
  anon_var_0._0_4_ = 1;
  std::array<chaiscript::Boxed_Value,_2UL>::~array((array<chaiscript::Boxed_Value,_2UL> *)local_48);
  detail::Function_Push_Pop::~Function_Push_Pop
            ((Function_Push_Pop *)
             &params._M_elems[1].m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        chaiscript::eval::detail::Function_Push_Pop fpp(t_ss);

        auto params = [&]() {
          // The RHS *must* be evaluated before the LHS
          // consider `var range = range(x)`
          // if we declare the variable in scope first, then the name lookup fails
          // for the RHS
          auto rhs = this->children[1]->eval(t_ss);
          auto lhs = this->children[0]->eval(t_ss);
          std::array<Boxed_Value, 2> p{std::move(lhs), std::move(rhs)};
          return p;
        }();

        if (params[0].is_return_value()) {
          throw exception::eval_error("Error, cannot assign to temporary value.");
        } else if (params[0].is_const()) {
          throw exception::eval_error("Error, cannot assign to constant value.");
        }

        if (m_oper != Operators::Opers::invalid && params[0].get_type_info().is_arithmetic() && params[1].get_type_info().is_arithmetic()) {
          try {
            return Boxed_Number::do_oper(m_oper, params[0], params[1]);
          } catch (const std::exception &) {
            throw exception::eval_error("Error with unsupported arithmetic assignment operation.");
          }
        } else if (m_oper == Operators::Opers::assign) {
          try {
            if (params[0].is_undef()) {
              if (!this->children.empty()
                  && ((this->children[0]->identifier == AST_Node_Type::Reference)
                      || (!this->children[0]->children.empty() && this->children[0]->children[0]->identifier == AST_Node_Type::Reference)))

              {
                /// \todo This does not handle the case of an unassigned reference variable
                ///       being assigned outside of its declaration
                params[0].assign(params[1]);
                params[0].reset_return_value();
                return params[1];
              } else {
                params[1] = detail::clone_if_necessary(std::move(params[1]), m_clone_loc, t_ss);
              }
            }

            try {
              return t_ss->call_function(this->text, m_loc, Function_Params{params}, t_ss.conversions());
            } catch (const exception::dispatch_error &e) {
              throw exception::eval_error("Unable to find appropriate'" + this->text + "' operator.", e.parameters, e.functions, false, *t_ss);
            }
          } catch (const exception::dispatch_error &e) {
            throw exception::eval_error("Missing clone or copy constructor for right hand side of equation",
                                        e.parameters,
                                        e.functions,
                                        false,
                                        *t_ss);
          }
        } else if (this->text == ":=") {
          if (params[0].is_undef() || Boxed_Value::type_match(params[0], params[1])) {
            params[0].assign(params[1]);
            params[0].reset_return_value();
          } else {
            throw exception::eval_error("Mismatched types in equation");
          }
        } else {
          try {
            return t_ss->call_function(this->text, m_loc, Function_Params{params}, t_ss.conversions());
          } catch (const exception::dispatch_error &e) {
            throw exception::eval_error("Unable to find appropriate'" + this->text + "' operator.", e.parameters, e.functions, false, *t_ss);
          }
        }

        return params[1];
      }